

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

uint __thiscall FirewirePort::GetBusGeneration(FirewirePort *this)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  void *this_00;
  FirewirePort *this_local;
  
  uVar2 = (this->super_BasePort).FwBusGeneration;
  uVar1 = raw1394_get_generation(this->handle);
  if (uVar2 != uVar1) {
    poVar3 = std::operator<<((this->super_BasePort).outStr,
                             "FirewirePort::GetBusGeneration mismatch: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->super_BasePort).FwBusGeneration);
    poVar3 = std::operator<<(poVar3,", ");
    uVar2 = raw1394_get_generation(this->handle);
    this_00 = (void *)std::ostream::operator<<(poVar3,uVar2);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return (this->super_BasePort).FwBusGeneration;
}

Assistant:

unsigned int FirewirePort::GetBusGeneration(void) const
{
    if (FwBusGeneration != raw1394_get_generation(handle))
        outStr << "FirewirePort::GetBusGeneration mismatch: " << FwBusGeneration
               << ", " << raw1394_get_generation(handle) << std::endl;
    return FwBusGeneration;
}